

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_wraith.cpp
# Opt level: O1

int AF_A_WraithInit(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  double dVar1;
  VM_UBYTE VVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  PClass *pPVar5;
  undefined8 uVar6;
  PClass *pPVar7;
  undefined4 in_register_00000014;
  VMValue *pVVar8;
  char *__assertion;
  bool bVar9;
  undefined1 auVar10 [16];
  
  pPVar5 = AActor::RegistrationInfo.MyClass;
  uVar6 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005c392c;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    puVar3 = (undefined8 *)(param->field_0).field_1.a;
    pVVar8 = param;
    if (puVar3 != (undefined8 *)0x0) {
      if (puVar3[1] == 0) {
        auVar10 = (**(code **)*puVar3)(puVar3);
        uVar6 = auVar10._8_8_;
        puVar3[1] = auVar10._0_8_;
      }
      pPVar7 = (PClass *)puVar3[1];
      bVar9 = pPVar7 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar9;
      uVar6 = CONCAT71((int7)((ulong)uVar6 >> 8),bVar9);
      pVVar8 = (VMValue *)(ulong)(pPVar7 == pPVar5 || bVar9);
      if (pPVar7 != pPVar5 && !bVar9) {
        do {
          pPVar7 = pPVar7->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar7 != (PClass *)0x0);
          if (pPVar7 == pPVar5) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005c392c;
      }
    }
    pPVar5 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar2 = param[1].field_0.field_3.Type, VVar2 != 0xff)) {
      if ((VVar2 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005c3901;
      puVar4 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar4 != (undefined8 *)0x0) {
        if (puVar4[1] == 0) {
          uVar6 = (**(code **)*puVar4)(puVar4,pVVar8,uVar6,ret);
          puVar4[1] = uVar6;
        }
        pPVar7 = (PClass *)puVar4[1];
        bVar9 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar5 && bVar9) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar9 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar5) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar9) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005c392c;
        }
      }
    }
    if (((numparam < 3) || (VVar2 = param[2].field_0.field_3.Type, VVar2 == 0xff)) ||
       ((VVar2 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      dVar1 = (double)puVar3[0xb];
      puVar3[0xb] = dVar1 + 48.0;
      if ((double)puVar3[0x25] < dVar1 + 48.0 + (double)puVar3[0x2c]) {
        puVar3[0xb] = (double)puVar3[0x25] - (double)puVar3[0x2c];
      }
      *(undefined1 *)((long)puVar3 + 0x231) = 0;
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005c3901:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005c392c:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_wraith.cpp"
                ,0x1a,"int AF_A_WraithInit(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_WraithInit)
{
	PARAM_ACTION_PROLOGUE;

	self->AddZ(48);

	// [RH] Make sure the wraith didn't go into the ceiling
	if (self->Top() > self->ceilingz)
	{
		self->SetZ(self->ceilingz - self->Height);
	}

	self->WeaveIndexZ = 0;			// index into floatbob
	return 0;
}